

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffpcln(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **array,void **nulval,int *status)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  int *in_stack_00000018;
  char errmsg [100];
  char *array1;
  LONGLONG nelem1;
  int icol_1;
  LONGLONG width;
  LONGLONG repeat;
  int typecode;
  int icol;
  size_t sizes [255];
  LONGLONG *repeats;
  long nrowbuf;
  LONGLONG currow;
  LONGLONG nwrite;
  LONGLONG ndone;
  LONGLONG ntotrows;
  int *in_stack_fffffffffffff6d8;
  LONGLONG *in_stack_fffffffffffff6e0;
  fitsfile *in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  undefined1 uVar1;
  fitsfile *in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff700;
  int in_stack_fffffffffffff704;
  fitsfile *in_stack_fffffffffffff708;
  int in_stack_fffffffffffff714;
  fitsfile *in_stack_fffffffffffff718;
  void *in_stack_fffffffffffff720;
  void *in_stack_fffffffffffff728;
  int *in_stack_fffffffffffff730;
  int local_884;
  undefined8 local_878;
  int local_870;
  int local_86c;
  long local_868 [11];
  undefined8 local_810;
  undefined8 local_808;
  undefined8 local_7f8;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_350;
  void *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  int local_14;
  int local_4;
  
  local_68 = (void *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  memset(local_868,0,0x7f8);
  local_7f8 = 1;
  local_808 = 1;
  local_810 = 1;
  local_7c0 = 2;
  local_7c8 = 2;
  local_778 = 4;
  local_770 = 4;
  local_728 = 8;
  local_720 = 8;
  local_5e8 = 8;
  local_5e0 = 8;
  local_718 = 4;
  local_5d8 = 8;
  local_350 = 0x10;
  if (*in_stack_00000018 < 1) {
    if (local_14 < 1) {
      *in_stack_00000018 = 0;
      local_4 = 0;
    }
    else {
      local_68 = malloc((long)local_14 << 3);
      if (local_68 == (void *)0x0) {
        *in_stack_00000018 = 0x71;
        local_4 = 0x71;
      }
      else {
        ffgnrwll(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
        ffgrsz(in_stack_fffffffffffff6f8,
               (long *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               &in_stack_fffffffffffff6e8->HDUposition);
        for (local_86c = 0; uVar1 = local_86c < local_14 && local_86c < 1000,
            local_86c < local_14 && local_86c < 1000; local_86c = local_86c + 1) {
          ffgtclll(in_stack_fffffffffffff718,in_stack_fffffffffffff714,
                   &in_stack_fffffffffffff708->HDUposition,
                   (LONGLONG *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                   (LONGLONG *)in_stack_fffffffffffff6f8,
                   (int *)CONCAT17(uVar1,in_stack_fffffffffffff6f0));
          *(undefined8 *)((long)local_68 + (long)local_86c * 8) = local_878;
          if (((*(int *)(local_20 + (long)local_86c * 4) == 1) ||
              (*(int *)(local_20 + (long)local_86c * 4) == 0x10)) ||
             (local_868[*(int *)(local_20 + (long)local_86c * 4)] == 0)) {
            ffpmsg((char *)0x20bb90);
            *in_stack_00000018 = 0x19a;
          }
          if (local_870 < 0) {
            ffpmsg((char *)0x20bbb4);
            *in_stack_00000018 = 0x140;
          }
          if (*in_stack_00000018 != 0) break;
        }
        if (*in_stack_00000018 == 0) {
          if (local_14 == 1) {
            ffpcn(in_stack_fffffffffffff708,in_stack_fffffffffffff704,in_stack_fffffffffffff700,
                  (LONGLONG)in_stack_fffffffffffff6f8,CONCAT17(uVar1,in_stack_fffffffffffff6f0),
                  (LONGLONG)in_stack_00000018,in_stack_fffffffffffff720,in_stack_fffffffffffff728,
                  in_stack_fffffffffffff730);
            free(local_68);
            local_4 = *in_stack_00000018;
          }
          else {
            local_58 = local_30;
            for (local_48 = 0; local_48 < local_38; local_48 = local_50 + local_48) {
              local_50 = local_38 - local_48;
              if (local_60 < local_38 - local_48) {
                local_50 = local_60;
              }
              for (local_884 = 0; local_884 < local_14; local_884 = local_884 + 1) {
                ffpcn(in_stack_fffffffffffff708,in_stack_fffffffffffff704,in_stack_fffffffffffff700,
                      (LONGLONG)in_stack_fffffffffffff6f8,CONCAT17(uVar1,in_stack_fffffffffffff6f0),
                      (LONGLONG)in_stack_00000018,in_stack_fffffffffffff720,
                      in_stack_fffffffffffff728,in_stack_fffffffffffff730);
                if (*in_stack_00000018 != 0) {
                  sprintf(&stack0xfffffffffffff6f8,
                          "Failed to write column %d data rows %lld-%lld (ffpcln)",
                          (ulong)*(uint *)(local_28 + (long)local_884 * 4),local_58,
                          local_58 + local_50 + -1);
                  ffpmsg((char *)0x20be9a);
                  break;
                }
              }
              if (*in_stack_00000018 != 0) break;
              local_58 = local_50 + local_58;
            }
            free(local_68);
            local_4 = *in_stack_00000018;
          }
        }
        else {
          free(local_68);
          local_4 = *in_stack_00000018;
        }
      }
    }
  }
  else {
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int ffpcln( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to write              */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to write (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)    */
            LONGLONG nrows,       /* I - number of rows to write             */
            void **array,     /* I - array of pointers to values to write    */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            int  *status)     /* IO - error status                           */
/*
  Write arrays of values to NCOLS table columns. This is an optimization
  to write all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
  Undefined elements for column i that are equal to *(nulval[i]) are set to
  the defined null value, unless nulval[i]=0,
  in which case no checking for undefined values will be performed.
*/
{
    LONGLONG ntotrows, ndone, nwrite, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot write to variable-length data (ffpcln)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_write_colnull(fptr, datatype[0], colnum[0], firstrow, 1,
			 nrows*repeats[0], 
			 array[0], nulval[0], status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nwrite = (nrows-ndone);
      if (nwrite > nrowbuf) nwrite = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nwrite*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_write_colnull(fptr, datatype[icol], colnum[icol], ndone+1, 1, 
			   nelem1, array1, nulval[icol], status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg,
		  "Failed to write column %d data rows %lld-%lld (ffpcln)",
		  colnum[icol], currow, currow+nwrite-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nwrite;
      ndone += nwrite;
    }

    free(repeats);
    return *status;
}